

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O3

istream * spvtools::utils::operator>>
                    (istream *is,
                    HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                    *value)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  istream *piVar5;
  void *pvVar6;
  uint uVar7;
  bool bVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  char cVar14;
  bool bVar15;
  int iVar16;
  bool bVar17;
  float float_val;
  uint local_50;
  
  (value->value_).data_ = 0;
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x19] & 0x10) != 0) {
    while( true ) {
      iVar2 = std::istream::peek();
      iVar2 = isspace(iVar2);
      if (iVar2 == 0) break;
      std::istream::get();
    }
  }
  iVar2 = std::istream::peek();
  if ((iVar2 != 0x2d) && (iVar2 != 0x30)) {
    std::istream::_M_extract<float>((float *)is);
    (value->value_).data_ = 0;
    if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0) {
      (value->value_).data_ = 0;
    }
    return is;
  }
  iVar3 = iVar2;
  if (iVar2 == 0x2d) {
    std::istream::get();
    iVar3 = std::istream::peek();
  }
  if (iVar3 == 0x30) {
    std::istream::get();
    uVar4 = std::istream::peek();
    if ((uVar4 & 0xffffffdf) == 0x58) {
      std::istream::get();
      iVar3 = std::istream::peek();
      while (iVar3 == 0x30) {
        std::istream::get();
        iVar3 = std::istream::peek();
      }
      iVar13 = 0x7f;
      bVar17 = false;
      local_50 = 0;
      bVar1 = 0;
      bVar8 = false;
      uVar4 = 0;
      do {
        if (iVar3 == 0x2e) {
          bVar15 = true;
        }
        else if (iVar3 == 0x70) {
          bVar17 = true;
          bVar15 = false;
        }
        else {
          iVar16 = isxdigit(iVar3);
          if (iVar16 == 0) goto LAB_001fb654;
          pvVar6 = memchr("0123456789",iVar3,0xb);
          if (pvVar6 == (void *)0x0) {
            cVar14 = -0x4a;
            pvVar6 = memchr("abcdef",iVar3,7);
            if (pvVar6 == (void *)0x0) {
              cVar14 = -0x43;
              pvVar6 = memchr("ABCDEF",iVar3,7);
              if (pvVar6 == (void *)0x0) goto LAB_001fb7aa;
            }
            bVar1 = ((char)pvVar6 - cVar14) + 10;
          }
          else {
            bVar1 = (char)pvVar6 + 0xb;
          }
          uVar7 = (uint)bVar1;
          iVar3 = 4;
          do {
            uVar11 = uVar7 & 8;
            if (bVar8) {
              if (iVar13 == 0x7fffffff) goto LAB_001fb654;
              uVar10 = uVar4 + 1;
              if (uVar10 == 0) {
                uVar10 = 0xffffffff;
              }
              uVar12 = (uVar11 >> 3) << (~(byte)uVar4 & 0x1f);
              if (uVar11 == 0) {
                uVar12 = 0;
              }
              if (0x1f < uVar4) {
                uVar12 = 0;
              }
              local_50 = local_50 | uVar12;
              iVar13 = iVar13 + 1;
              uVar4 = uVar10;
            }
            bVar8 = (bool)(bVar8 | uVar11 != 0);
            uVar7 = uVar7 * 2;
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
          bVar15 = false;
          bVar1 = 1;
        }
        std::istream::get();
        iVar3 = std::istream::peek();
      } while ((!bVar15) && (!bVar17));
      if (bVar15 == true && !bVar17) {
        uVar7 = 0;
        do {
          bVar8 = true;
          if (iVar3 != 0x70) {
            iVar16 = isxdigit(iVar3);
            if (iVar16 == 0) goto LAB_001fb654;
            pvVar6 = memchr("0123456789",iVar3,0xb);
            if (pvVar6 == (void *)0x0) {
              cVar14 = -0x4a;
              pvVar6 = memchr("abcdef",iVar3,7);
              if (pvVar6 == (void *)0x0) {
                cVar14 = -0x43;
                pvVar6 = memchr("ABCDEF",iVar3,7);
                if (pvVar6 == (void *)0x0) {
LAB_001fb7aa:
                  __assert_fail("false && \"This was called with a non-hex character\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/hex_float.h"
                                ,0x2dd,"uint8_t spvtools::utils::get_nibble_from_character(int)");
                }
              }
              bVar9 = ((char)pvVar6 - cVar14) + 10;
            }
            else {
              bVar9 = (char)pvVar6 + 0xb;
            }
            uVar11 = (uint)bVar9;
            iVar3 = 4;
            do {
              uVar10 = uVar11 >> 3 & 1;
              uVar7 = uVar7 | uVar10;
              if ((bVar1 == 0) && (uVar7 == 0)) {
                iVar13 = iVar13 + -1;
              }
              else {
                uVar12 = uVar10 << (~(byte)uVar4 & 0x1f);
                if (uVar10 == 0) {
                  uVar12 = 0;
                }
                if (0x1f < uVar4) {
                  uVar12 = 0;
                }
                local_50 = local_50 | uVar12;
                uVar4 = uVar4 + 1;
                if (uVar4 == 0) {
                  uVar4 = 0xffffffff;
                }
              }
              uVar11 = uVar11 * 2;
              iVar3 = iVar3 + -1;
              bVar8 = bVar17;
            } while (iVar3 != 0);
          }
          bVar17 = bVar8;
          std::istream::get();
          iVar3 = std::istream::peek();
        } while (!bVar17);
      }
      bVar17 = false;
      bVar9 = 1;
      bVar8 = false;
      iVar16 = 0;
      do {
        if (bVar8) {
          if (9 < iVar3 - 0x30U) {
            iVar16 = iVar16 * (char)bVar9;
            if ((iVar16 < 0) || (iVar13 < 0)) {
              if ((iVar16 < 0) && (iVar13 < 0)) {
                iVar3 = iVar13 + 0x7ffffffe;
                uVar4 = 0x80000002;
                if (iVar3 != -iVar16 && SBORROW4(iVar3,-iVar16) == iVar3 + iVar16 < 0) {
                  uVar4 = iVar16 + iVar13;
                }
              }
              else {
                uVar4 = iVar16 + iVar13;
              }
            }
            else {
              uVar4 = iVar13 + iVar16;
              if (0x7ffffffe - iVar13 <= iVar16) {
                uVar4 = 0x7ffffffe;
              }
            }
            bVar17 = local_50 == 0;
            uVar11 = uVar4 - 1;
            local_50 = local_50 << ~(bVar1 | bVar17);
            uVar7 = local_50 >> 1 | 0x80000000;
            if ((bool)(~bVar1 & bVar17)) {
              uVar4 = 0;
              uVar7 = local_50;
            }
            if (bVar1 == 0 && !bVar17) {
              uVar4 = uVar11;
            }
            if (0 < (int)uVar4) {
              uVar7 = local_50;
            }
            uVar7 = uVar7 >> 9;
            if (((int)uVar4 < 0) && (!(bool)(~bVar1 & bVar17))) {
              uVar10 = uVar7;
              uVar11 = uVar4;
              do {
                uVar11 = uVar11 + 1;
                uVar7 = uVar10 >> 1;
                uVar4 = uVar11;
                if (uVar10 < 2) {
                  uVar4 = 0;
                }
              } while (((int)uVar4 < 0) && (bVar17 = 1 < uVar10, uVar10 = uVar7, bVar17));
            }
            uVar11 = 0xff;
            if ((int)uVar4 < 0xff) {
              uVar11 = uVar4;
            }
            if (0xff < (int)uVar4) {
              uVar7 = 0;
            }
            (value->value_).data_ = (uVar11 & 0xff) << 0x17 | (uint)(iVar2 == 0x2d) << 0x1f | uVar7;
            return is;
          }
LAB_001fb420:
          bVar8 = (int)((0x8000002eU - iVar3) / 10) <= iVar16;
          iVar16 = iVar3 + -0x30 + iVar16 * 10;
          if (bVar8) {
            iVar16 = 0x7ffffffe;
          }
          bVar8 = true;
        }
        else {
          if ((iVar3 != 0x2d) && (iVar3 != 0x2b)) {
            if (iVar3 - 0x30U < 10) goto LAB_001fb420;
LAB_001fb654:
            std::ios::clear((int)is + (int)*(undefined8 *)(*(long *)is + -0x18));
            return is;
          }
          if (bVar17) goto LAB_001fb654;
          bVar9 = -(iVar3 == 0x2d) | 1;
          bVar17 = true;
          bVar8 = false;
        }
        std::istream::get();
        iVar3 = std::istream::peek();
      } while( true );
    }
    std::istream::unget();
  }
  piVar5 = ParseNormalFloat<spvtools::utils::FloatProxy<float>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>>>
                     (is,iVar2 == 0x2d,value);
  return piVar5;
}

Assistant:

std::istream& operator>>(std::istream& is, HexFloat<T, Traits>& value) {
  using HF = HexFloat<T, Traits>;
  using uint_type = typename HF::uint_type;
  using int_type = typename HF::int_type;

  value.set_value(static_cast<typename HF::native_type>(0.f));

  if (is.flags() & std::ios::skipws) {
    // If the user wants to skip whitespace , then we should obey that.
    while (std::isspace(is.peek())) {
      is.get();
    }
  }

  auto next_char = is.peek();
  bool negate_value = false;

  if (next_char != '-' && next_char != '0') {
    return ParseNormalFloat(is, negate_value, value);
  }

  if (next_char == '-') {
    negate_value = true;
    is.get();
    next_char = is.peek();
  }

  if (next_char == '0') {
    is.get();  // We may have to unget this.
    auto maybe_hex_start = is.peek();
    if (maybe_hex_start != 'x' && maybe_hex_start != 'X') {
      is.unget();
      return ParseNormalFloat(is, negate_value, value);
    } else {
      is.get();  // Throw away the 'x';
    }
  } else {
    return ParseNormalFloat(is, negate_value, value);
  }

  // This "looks" like a hex-float so treat it as one.
  bool seen_p = false;
  bool seen_dot = false;

  // The mantissa bits, without the most significant 1 bit, and with the
  // the most recently read bits in the least significant positions.
  uint_type fraction = 0;
  // The number of mantissa bits that have been read, including the leading 1
  // bit that is not written into 'fraction'.
  uint_type fraction_index = 0;

  // TODO(dneto): handle overflow and underflow
  int_type exponent = HF::exponent_bias;

  // Strip off leading zeros so we don't have to special-case them later.
  while ((next_char = is.peek()) == '0') {
    is.get();
  }

  // Does the mantissa, as written, have non-zero digits to the left of
  // the decimal point.  Assume no until proven otherwise.
  bool has_integer_part = false;
  bool bits_written = false;  // Stays false until we write a bit.

  // Scan the mantissa hex digits until we see a '.' or the 'p' that
  // starts the exponent.
  while (!seen_p && !seen_dot) {
    // Handle characters that are left of the fractional part.
    if (next_char == '.') {
      seen_dot = true;
    } else if (next_char == 'p') {
      seen_p = true;
    } else if (::isxdigit(next_char)) {
      // We have stripped all leading zeroes and we have not yet seen a ".".
      has_integer_part = true;
      int number = get_nibble_from_character(next_char);
      for (int i = 0; i < 4; ++i, number <<= 1) {
        uint_type write_bit = (number & 0x8) ? 0x1 : 0x0;
        if (bits_written) {
          // If we are here the bits represented belong in the fractional
          // part of the float, and we have to adjust the exponent accordingly.
          fraction = detail::set_nth_most_significant_bit(fraction, write_bit,
                                                          fraction_index);
          // Increment the fraction index. If the input has bizarrely many
          // significant digits, then silently drop them.
          detail::saturated_inc(fraction_index);
          if (!detail::saturated_inc(exponent)) {
            // Overflow failure
            is.setstate(std::ios::failbit);
            return is;
          }
        }
        // Since this updated after setting fraction bits, this effectively
        // drops the leading 1 bit.
        bits_written |= write_bit != 0;
      }
    } else {
      // We have not found our exponent yet, so we have to fail.
      is.setstate(std::ios::failbit);
      return is;
    }
    is.get();
    next_char = is.peek();
  }

  // Finished reading the part preceding any '.' or 'p'.

  bits_written = false;
  while (seen_dot && !seen_p) {
    // Handle only fractional parts now.
    if (next_char == 'p') {
      seen_p = true;
    } else if (::isxdigit(next_char)) {
      int number = get_nibble_from_character(next_char);
      for (int i = 0; i < 4; ++i, number <<= 1) {
        uint_type write_bit = (number & 0x8) ? 0x01 : 0x00;
        bits_written |= write_bit != 0;
        if ((!has_integer_part) && !bits_written) {
          // Handle modifying the exponent here this way we can handle
          // an arbitrary number of hex values without overflowing our
          // integer.
          if (!detail::saturated_dec(exponent)) {
            // Overflow failure
            is.setstate(std::ios::failbit);
            return is;
          }
        } else {
          fraction = detail::set_nth_most_significant_bit(fraction, write_bit,
                                                          fraction_index);
          // Increment the fraction index. If the input has bizarrely many
          // significant digits, then silently drop them.
          detail::saturated_inc(fraction_index);
        }
      }
    } else {
      // We still have not found our 'p' exponent yet, so this is not a valid
      // hex-float.
      is.setstate(std::ios::failbit);
      return is;
    }
    is.get();
    next_char = is.peek();
  }

  // Finished reading the part preceding 'p'.
  // In hex floats syntax, the binary exponent is required.

  bool seen_exponent_sign = false;
  int8_t exponent_sign = 1;
  bool seen_written_exponent_digits = false;
  // The magnitude of the exponent, as written, or the sentinel value to signal
  // overflow.
  int_type written_exponent = 0;
  // A sentinel value signalling overflow of the magnitude of the written
  // exponent.  We'll assume that -written_exponent_overflow is valid for the
  // type. Later we may add 1 or subtract 1 from the adjusted exponent, so leave
  // room for an extra 1.
  const int_type written_exponent_overflow =
      std::numeric_limits<int_type>::max() - 1;
  while (true) {
    if (!seen_written_exponent_digits &&
        (next_char == '-' || next_char == '+')) {
      if (seen_exponent_sign) {
        is.setstate(std::ios::failbit);
        return is;
      }
      seen_exponent_sign = true;
      exponent_sign = (next_char == '-') ? -1 : 1;
    } else if (::isdigit(next_char)) {
      seen_written_exponent_digits = true;
      // Hex-floats express their exponent as decimal.
      int_type digit =
          static_cast<int_type>(static_cast<int_type>(next_char) - '0');
      if (written_exponent >= (written_exponent_overflow - digit) / 10) {
        // The exponent is very big. Saturate rather than overflow the exponent.
        // signed integer, which would be undefined behaviour.
        written_exponent = written_exponent_overflow;
      } else {
        written_exponent = static_cast<int_type>(
            static_cast<int_type>(written_exponent * 10) + digit);
      }
    } else {
      break;
    }
    is.get();
    next_char = is.peek();
  }
  if (!seen_written_exponent_digits) {
    // Binary exponent had no digits.
    is.setstate(std::ios::failbit);
    return is;
  }

  written_exponent = static_cast<int_type>(written_exponent * exponent_sign);
  // Now fold in the exponent bias into the written exponent, updating exponent.
  // But avoid undefined behaviour that would result from overflowing int_type.
  if (written_exponent >= 0 && exponent >= 0) {
    // Saturate up to written_exponent_overflow.
    if (written_exponent_overflow - exponent > written_exponent) {
      exponent = static_cast<int_type>(written_exponent + exponent);
    } else {
      exponent = written_exponent_overflow;
    }
  } else if (written_exponent < 0 && exponent < 0) {
    // Saturate down to -written_exponent_overflow.
    if (written_exponent_overflow + exponent > -written_exponent) {
      exponent = static_cast<int_type>(written_exponent + exponent);
    } else {
      exponent = static_cast<int_type>(-written_exponent_overflow);
    }
  } else {
    // They're of opposing sign, so it's safe to add.
    exponent = static_cast<int_type>(written_exponent + exponent);
  }

  bool is_zero = (!has_integer_part) && (fraction == 0);
  if ((!has_integer_part) && !is_zero) {
    fraction = static_cast<uint_type>(fraction << 1);
    exponent = static_cast<int_type>(exponent - 1);
  } else if (is_zero) {
    exponent = 0;
  }

  if (exponent <= 0 && !is_zero) {
    fraction = static_cast<uint_type>(fraction >> 1);
    fraction |= static_cast<uint_type>(1) << HF::top_bit_left_shift;
  }

  fraction = (fraction >> HF::fraction_right_shift) & HF::fraction_encode_mask;

  const int_type max_exponent =
      SetBits<uint_type, 0, HF::num_exponent_bits>::get;

  // Handle denorm numbers
  while (exponent < 0 && !is_zero) {
    fraction = static_cast<uint_type>(fraction >> 1);
    exponent = static_cast<int_type>(exponent + 1);

    fraction &= HF::fraction_encode_mask;
    if (fraction == 0) {
      // We have underflowed our fraction. We should clamp to zero.
      is_zero = true;
      exponent = 0;
    }
  }

  // We have overflowed so we should be inf/-inf.
  if (exponent > max_exponent) {
    exponent = max_exponent;
    fraction = 0;
  }

  uint_type output_bits = static_cast<uint_type>(
      static_cast<uint_type>(negate_value ? 1 : 0) << HF::top_bit_left_shift);
  output_bits |= fraction;

  uint_type shifted_exponent = static_cast<uint_type>(
      static_cast<uint_type>(exponent << HF::exponent_left_shift) &
      HF::exponent_mask);
  output_bits |= shifted_exponent;

  T output_float(output_bits);
  value.set_value(output_float);

  return is;
}